

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O2

void Wln_WriteVerInt(FILE *pFile,Wln_Ntk_t *p)

{
  Vec_Int_t *p_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iObj;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar14;
  char *pcVar15;
  uint uVar16;
  char *pcVar17;
  int *piVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  size_t __size;
  char Range [100];
  
  fprintf((FILE *)pFile,"module %s ( ",p->pName);
  uVar19 = 1;
  fwrite("\n   ",4,1,(FILE *)pFile);
  if (0 < (p->vCis).nSize) {
    Wln_WriteVerIntVec(pFile,p,&p->vCis,3);
    fwrite(",\n   ",5,1,(FILE *)pFile);
  }
  if (0 < (p->vCos).nSize) {
    Wln_WriteVerIntVec(pFile,p,&p->vCos,3);
  }
  fwrite("  );\n",5,1,(FILE *)pFile);
  p_00 = &p->vTypes;
  do {
    if ((long)(p->vTypes).nSize <= (long)uVar19) {
      fputc(10,(FILE *)pFile);
      for (iVar6 = 0; iVar6 < (p->vFfs).nSize; iVar6 = iVar6 + 1) {
        iVar3 = Vec_IntEntry(&p->vFfs,iVar6);
        fwrite("         ",9,1,(FILE *)pFile);
        fprintf((FILE *)pFile,"%s (","ABC_DFFRSE");
        piVar18 = &DAT_007d1fb4;
        for (lVar20 = 0; lVar20 < p->vFanins[iVar3].nSize; lVar20 = lVar20 + 1) {
          iVar4 = Wln_ObjFanin(p,iVar3,(int)lVar20);
          if (iVar4 != 0) {
            iVar5 = *piVar18;
            pcVar15 = Wln_ObjName(p,iVar4);
            fprintf((FILE *)pFile," .%s(%s),",(long)&DAT_007d1fb4 + (long)iVar5,pcVar15);
          }
          piVar18 = piVar18 + 1;
        }
        pcVar15 = Wln_ObjName(p,iVar3);
        fprintf((FILE *)pFile," .%s(%s) ) ;\n","q",pcVar15);
      }
      fputc(10,(FILE *)pFile);
      fwrite("endmodule\n\n",0xb,1,(FILE *)pFile);
      return;
    }
    iVar6 = (int)uVar19;
    uVar1 = Wln_ObjRangeEnd(p,iVar6);
    uVar2 = Wln_ObjRangeBeg(p,iVar6);
    uVar7 = -uVar1;
    if (0 < (int)uVar1) {
      uVar7 = uVar1;
    }
    iVar3 = Abc_Base10Log(uVar7 + 1);
    uVar7 = -uVar2;
    if (0 < (int)uVar2) {
      uVar7 = uVar2;
    }
    iVar4 = Abc_Base10Log(uVar7 + 1);
    pcVar15 = "       ";
    if (p->fSmtLib == 0) {
      iVar5 = Wln_ObjIsSigned(p,iVar6);
      pcVar15 = "signed ";
      if (iVar5 == 0) {
        pcVar15 = "       ";
      }
    }
    sprintf(Range,"%s[%d:%d]%*s",pcVar15,(ulong)uVar1,(ulong)uVar2,
            (ulong)(((((int)uVar2 >> 0x1f) + ((int)uVar1 >> 0x1f)) - (iVar3 + iVar4)) + 8),"");
    fwrite("  ",2,1,(FILE *)pFile);
    iVar3 = Wln_ObjIsCi(p,iVar6);
    pcVar15 = "input  ";
    if (iVar3 == 0) {
      iVar3 = Vec_IntEntry(p_00,iVar6);
      pcVar15 = "       ";
      if (iVar3 == 4) {
        pcVar15 = "output ";
      }
    }
    fwrite(pcVar15,7,1,(FILE *)pFile);
    iVar3 = Wln_ObjIsCio(p,iVar6);
    if (iVar3 != 0) {
      pcVar15 = Wln_ObjName(p,iVar6);
      fprintf((FILE *)pFile,"wire %s %s ;\n",Range,pcVar15);
      iVar3 = Wln_ObjIsCi(p,iVar6);
      if (iVar3 == 0) {
        fwrite("  assign                         ",0x21,1,(FILE *)pFile);
        pcVar15 = Wln_ObjName(p,iVar6);
        iVar6 = Wln_ObjFanin0(p,iVar6);
        pcVar8 = Wln_ObjName(p,iVar6);
        pcVar17 = "%-16s = %s ;\n";
LAB_00322d6e:
        fprintf((FILE *)pFile,pcVar17,pcVar15,pcVar8);
      }
      goto LAB_0032309d;
    }
    iVar3 = Vec_IntEntry(p_00,iVar6);
    pcVar15 = "reg  %s ";
    if (iVar3 != 0x2b) {
      iVar3 = Vec_IntEntry(p_00,iVar6);
      pcVar15 = "wire %s ";
      if (iVar3 == 0x2c) {
        pcVar15 = "reg  %s ";
      }
    }
    fprintf((FILE *)pFile,pcVar15,Range);
    iVar3 = Vec_IntEntry(p_00,iVar6);
    if (iVar3 == 0x4d) {
      pcVar15 = Wln_ObjName(p,iVar6);
      uVar7 = Wln_ObjFanin1(p,iVar6);
      fprintf((FILE *)pFile,"%s ;              table%d",pcVar15,(ulong)uVar7);
      iVar3 = Wln_ObjFanin0(p,iVar6);
      pcVar15 = Wln_ObjName(p,iVar3);
      fprintf((FILE *)pFile," s%d_Index(%s, ",uVar19 & 0xffffffff,pcVar15);
      pcVar15 = Wln_ObjName(p,iVar6);
      pcVar8 = "%s)";
      goto LAB_00322e4e;
    }
    iVar3 = Vec_IntEntry(p_00,iVar6);
    if (iVar3 == 0x4b) {
      pcVar15 = Wln_ObjName(p,iVar6);
      fprintf((FILE *)pFile,"%s ;           LUT",pcVar15);
      iVar3 = Wln_ObjFanin0(p,iVar6);
      pcVar15 = Wln_ObjName(p,iVar3);
      fprintf((FILE *)pFile," lut%d (%s, ",uVar19 & 0xffffffff,pcVar15);
      for (iVar3 = 1; iVar3 < p->vFanins[uVar19].nSize; iVar3 = iVar3 + 1) {
        iVar4 = Wln_ObjFanin(p,iVar6,iVar3);
        pcVar15 = Wln_ObjName(p,iVar4);
        fprintf((FILE *)pFile,"%s, ",pcVar15);
      }
      pcVar15 = Wln_ObjName(p,iVar6);
      pcVar8 = "%s)";
      goto LAB_00322f59;
    }
    iVar3 = Vec_IntEntry(p_00,iVar6);
    if (iVar3 == 0x61) {
      pcVar15 = Wln_ObjName(p,iVar6);
      pcVar8 = Wln_ObjConstString(p,iVar6);
      fprintf((FILE *)pFile,"%-16s = %s",pcVar15,pcVar8);
LAB_00323066:
      pcVar15 = "";
      if (p->fSmtLib != 0) {
        iVar6 = Wln_ObjIsSigned(p,iVar6);
        pcVar15 = " // signed SMT-LIB operator";
        if (iVar6 == 0) {
          pcVar15 = "";
        }
      }
      pcVar8 = " ;%s\n";
LAB_00323096:
      fprintf((FILE *)pFile,pcVar8,pcVar15);
    }
    else {
      iVar3 = Vec_IntEntry(p_00,iVar6);
      if ((iVar3 == 0x49) || (iVar3 = Vec_IntEntry(p_00,iVar6), iVar3 == 0x48)) {
        uVar7 = Wln_ObjFanin1(p,iVar6);
        iVar3 = Wln_ObjRange(p,iVar6);
        if (((int)uVar7 < 1) || (iVar4 = Wln_ObjRange(p,iVar6), iVar4 <= (int)uVar7)) {
          __assert_fail("Num0 > 0 && Num0 < Wln_ObjRange(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnWriteVer.c"
                        ,0xcb,"void Wln_WriteVerInt(FILE *, Wln_Ntk_t *)");
        }
        pcVar15 = Wln_ObjName(p,iVar6);
        fprintf((FILE *)pFile,"%-16s = ",pcVar15);
        iVar4 = Vec_IntEntry(p_00,iVar6);
        iVar5 = Wln_ObjFanin0(p,iVar6);
        pcVar15 = Wln_ObjName(p,iVar5);
        iVar5 = Wln_ObjFanin0(p,iVar6);
        pcVar8 = Wln_ObjName(p,iVar5);
        if (iVar4 == 0x49) {
          pcVar17 = "(%s >> %d) | (%s << %d)";
        }
        else {
          pcVar17 = "(%s << %d) | (%s >> %d)";
        }
        fprintf((FILE *)pFile,pcVar17,pcVar15,(ulong)uVar7,pcVar8,(ulong)(iVar3 - uVar7));
        goto LAB_00323066;
      }
      iVar3 = Vec_IntEntry(p_00,iVar6);
      if (iVar3 != 0x2b) {
        iVar3 = Vec_IntEntry(p_00,iVar6);
        if (iVar3 == 0x2c) {
          pcVar15 = Wln_ObjName(p,iVar6);
          fprintf((FILE *)pFile,"%s ;\n",pcVar15);
          fwrite("         ",9,1,(FILE *)pFile);
          fwrite("always @( ",10,1,(FILE *)pFile);
          for (iVar3 = 0; iVar3 < p->vFanins[uVar19].nSize; iVar3 = iVar3 + 1) {
            iVar4 = Wln_ObjFanin(p,iVar6,iVar3);
            if (iVar4 != 0) {
              pcVar15 = " or ";
              if (iVar3 == 0) {
                pcVar15 = "";
              }
              pcVar8 = Wln_ObjName(p,iVar4);
              fprintf((FILE *)pFile,"%s%s",pcVar15,pcVar8);
            }
          }
          fwrite(" )\n",3,1,(FILE *)pFile);
          fwrite("           ",0xb,1,(FILE *)pFile);
          fwrite("begin\n",6,1,(FILE *)pFile);
          fwrite("             ",0xd,1,(FILE *)pFile);
          paVar14 = &p->vFanins[uVar19].field_2;
          if (2 < p->vFanins[uVar19].nSize) {
            paVar14 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar14->pArray[0];
          }
          pcVar15 = Wln_ObjName(p,paVar14->Array[0]);
          fprintf((FILE *)pFile,"case ( %s )\n",pcVar15);
          for (iVar3 = 0; iVar3 < p->vFanins[uVar19].nSize; iVar3 = iVar3 + 1) {
            iVar4 = Wln_ObjFanin(p,iVar6,iVar3);
            if ((iVar3 != 0) && (iVar4 != 0)) {
              fwrite("               ",0xf,1,(FILE *)pFile);
              fprintf((FILE *)pFile,"%d\'b",(ulong)(p->vFanins[uVar19].nSize - 1));
              for (iVar4 = p->vFanins[uVar19].nSize; 1 < iVar4; iVar4 = iVar4 + -1) {
                fprintf((FILE *)pFile,"%d",(ulong)(iVar3 + 1 == iVar4));
              }
              pcVar15 = Wln_ObjName(p,iVar6);
              fprintf((FILE *)pFile," : %s = ",pcVar15);
              iVar4 = Wln_ObjFanin(p,iVar6,iVar3);
              pcVar15 = Wln_ObjName(p,iVar4);
              fprintf((FILE *)pFile,"%s ;\n",pcVar15);
            }
          }
          fwrite("               ",0xf,1,(FILE *)pFile);
          fwrite("default",7,1,(FILE *)pFile);
          pcVar15 = Wln_ObjName(p,iVar6);
          fprintf((FILE *)pFile," : %s = ",pcVar15);
          uVar7 = Wln_ObjRange(p,iVar6);
          fprintf((FILE *)pFile,"%d\'b",(ulong)uVar7);
          for (iVar6 = Wln_ObjRange(p,iVar6); 0 < iVar6; iVar6 = iVar6 + -1) {
            fprintf((FILE *)pFile,"%d",0);
          }
          fwrite(" ;\n",3,1,(FILE *)pFile);
          fwrite("             ",0xd,1,(FILE *)pFile);
          fwrite("endcase\n",8,1,(FILE *)pFile);
          fwrite("           ",0xb,1,(FILE *)pFile);
          pcVar15 = "end\n";
LAB_00323831:
          fwrite(pcVar15,4,1,(FILE *)pFile);
          goto LAB_0032309d;
        }
        iVar3 = Vec_IntEntry(p_00,iVar6);
        if (iVar3 == 0x30) {
          iVar3 = Wln_ObjFanin0(p,iVar6);
          iVar3 = Wln_ObjRange(p,iVar3);
          iVar4 = Wln_ObjRange(p,iVar6);
          if (1 << ((byte)iVar3 & 0x1f) != iVar4) {
            __assert_fail("(1 << nRange) == Wln_ObjRange(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnWriteVer.c"
                          ,0x111,"void Wln_WriteVerInt(FILE *, Wln_Ntk_t *)");
          }
          pcVar15 = Wln_ObjName(p,iVar6);
          uVar7 = 0;
          fprintf((FILE *)pFile,"%s ;\n",pcVar15);
          iVar4 = 0;
          if (0 < iVar3) {
            iVar4 = iVar3;
          }
          uVar1 = iVar3 - 1;
          while( true ) {
            iVar3 = Wln_ObjRange(p,iVar6);
            fwrite("         ",9,1,(FILE *)pFile);
            if (iVar3 <= (int)uVar7) break;
            fwrite("wire ",5,1,(FILE *)pFile);
            pcVar15 = Wln_ObjName(p,iVar6);
            fprintf((FILE *)pFile,"%s_",pcVar15);
            iVar3 = iVar4;
            uVar2 = uVar1;
            while (bVar21 = iVar3 != 0, iVar3 = iVar3 + -1, bVar21) {
              fprintf((FILE *)pFile,"%d",(ulong)((uVar7 >> (uVar2 & 0x1f) & 1) != 0));
              uVar2 = uVar2 - 1;
            }
            fwrite(" = ",3,1,(FILE *)pFile);
            iVar3 = 0;
            while (-iVar4 != iVar3) {
              uVar2 = iVar3 + uVar1;
              bVar21 = iVar3 == 0;
              iVar3 = iVar3 + -1;
              pcVar15 = " & ";
              if (bVar21) {
                pcVar15 = "";
              }
              pcVar8 = "\r\n\t ";
              if ((uVar7 >> (uVar2 & 0x1f) & 1) == 0) {
                pcVar8 = " & ~";
              }
              paVar14 = &p->vFanins[uVar19].field_2;
              if (2 < p->vFanins[uVar19].nSize) {
                paVar14 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar14->pArray[0];
              }
              pcVar17 = Wln_ObjName(p,paVar14->Array[0]);
              fprintf((FILE *)pFile,"%s%s%s[%d]",pcVar15,pcVar8 + 3,pcVar17,(ulong)uVar2);
            }
            fwrite(" ;\n",3,1,(FILE *)pFile);
            uVar7 = uVar7 + 1;
          }
          pcVar15 = Wln_ObjName(p,iVar6);
          fprintf((FILE *)pFile,"assign %s = { ",pcVar15);
          uVar7 = Wln_ObjRange(p,iVar6);
          while (0 < (int)uVar7) {
            uVar2 = uVar7 - 1;
            iVar3 = Wln_ObjRange(p,iVar6);
            pcVar15 = "T = %d\t\t";
            if ((int)uVar7 < iVar3) {
              pcVar15 = "    \"%s\", ";
            }
            pcVar8 = Wln_ObjName(p,iVar6);
            fprintf((FILE *)pFile,"%s%s_",pcVar15 + 8,pcVar8);
            iVar3 = iVar4;
            uVar16 = uVar1;
            while (bVar21 = iVar3 != 0, iVar3 = iVar3 + -1, uVar7 = uVar2, bVar21) {
              fprintf((FILE *)pFile,"%d",(ulong)((uVar2 >> (uVar16 & 0x1f) & 1) != 0));
              uVar16 = uVar16 - 1;
            }
          }
          fwrite(" } ;\n",5,1,(FILE *)pFile);
          goto LAB_0032309d;
        }
        iVar3 = Vec_IntEntry(p_00,iVar6);
        if (iVar3 == 0x62) {
          pcVar15 = Wln_ObjName(p,iVar6);
          fprintf((FILE *)pFile,"%s ;\n",pcVar15);
          fwrite("         ",9,1,(FILE *)pFile);
          fwrite("assign ",7,1,(FILE *)pFile);
          pcVar15 = Wln_ObjName(p,iVar6);
          iVar3 = Wln_ObjFanin0(p,iVar6);
          pcVar8 = Wln_ObjName(p,iVar3);
          iVar3 = Wln_ObjFanin2(p,iVar6);
          pcVar17 = Wln_ObjName(p,iVar3);
          paVar14 = &p->vFanins[uVar19].field_2;
          if (2 < p->vFanins[uVar19].nSize) {
            paVar14 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar14->pArray[0];
          }
          pcVar9 = Wln_ObjName(p,*(int *)((long)paVar14 + 0xc));
          iVar3 = Wln_ObjFanin1(p,iVar6);
          pcVar10 = Wln_ObjName(p,iVar3);
          iVar3 = Wln_ObjFanin2(p,iVar6);
          pcVar11 = Wln_ObjName(p,iVar3);
          paVar14 = &p->vFanins[uVar19].field_2;
          if (2 < p->vFanins[uVar19].nSize) {
            paVar14 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar14->pArray[0];
          }
          pcVar12 = Wln_ObjName(p,*(int *)((long)paVar14 + 0xc));
          iVar6 = Wln_ObjFanin1(p,iVar6);
          pcVar13 = Wln_ObjName(p,iVar6);
          fprintf((FILE *)pFile,"%s = %s ? %s + %s + %s : %s - %s - %s ;\n",pcVar15,pcVar8,pcVar17,
                  pcVar9,pcVar10,pcVar11,pcVar12,pcVar13);
          goto LAB_0032309d;
        }
        iVar3 = Vec_IntEntry(p_00,iVar6);
        if ((iVar3 == 0x50) || (iVar3 = Vec_IntEntry(p_00,iVar6), iVar3 == 0x51)) {
          pcVar15 = Wln_ObjName(p,iVar6);
          iVar4 = 0;
          fprintf((FILE *)pFile,"%s ;\n",pcVar15);
          fwrite("         ",9,1,(FILE *)pFile);
          iVar3 = Vec_IntEntry(p_00,iVar6);
          pcVar15 = "ABC_WRITE";
          if (iVar3 == 0x50) {
            pcVar15 = "ABC_READ";
          }
          fprintf((FILE *)pFile,"%s (",pcVar15);
          for (; iVar4 < p->vFanins[uVar19].nSize; iVar4 = iVar4 + 1) {
            iVar3 = Wln_ObjFanin(p,iVar6,iVar4);
            if (iVar3 != 0) {
              pcVar15 = "data";
              if (iVar4 == 1) {
                pcVar15 = "addr";
              }
              if (iVar4 == 0) {
                pcVar15 = "mem_in";
              }
              pcVar8 = Wln_ObjName(p,iVar3);
              fprintf((FILE *)pFile," .%s(%s),",pcVar15,pcVar8);
            }
          }
          iVar3 = Vec_IntEntry(p_00,iVar6);
          pcVar15 = "mem_out";
          if (iVar3 == 0x50) {
            pcVar15 = "data";
          }
          pcVar8 = Wln_ObjName(p,iVar6);
          pcVar17 = " .%s(%s) ) ;\n";
          goto LAB_00322d6e;
        }
        iVar3 = Vec_IntEntry(p_00,iVar6);
        pcVar15 = Wln_ObjName(p,iVar6);
        if (iVar3 != 0x59) {
          fprintf((FILE *)pFile,"%-16s = ",pcVar15);
          iVar3 = Vec_IntEntry(p_00,iVar6);
          if (iVar3 == 0xb) {
            iVar3 = Wln_ObjFanin0(p,iVar6);
          }
          else {
            iVar3 = Vec_IntEntry(p_00,iVar6);
            if (iVar3 != 0x15) {
              iVar3 = Vec_IntEntry(p_00,iVar6);
              if (iVar3 == 0x3a) {
                iVar3 = Wln_ObjFanin0(p,iVar6);
                pcVar15 = Wln_ObjName(p,iVar3);
                pcVar8 = "-%s";
              }
              else {
                iVar3 = Vec_IntEntry(p_00,iVar6);
                if (iVar3 == 0xc) {
                  iVar3 = Wln_ObjFanin0(p,iVar6);
                  pcVar15 = Wln_ObjName(p,iVar3);
                  pcVar8 = "~%s";
                }
                else {
                  iVar3 = Vec_IntEntry(p_00,iVar6);
                  if (iVar3 == 0x24) {
                    iVar3 = Wln_ObjFanin0(p,iVar6);
                    pcVar15 = Wln_ObjName(p,iVar3);
                    pcVar8 = "!%s";
                  }
                  else {
                    iVar3 = Vec_IntEntry(p_00,iVar6);
                    if (iVar3 != 0x1e) {
                      iVar3 = Vec_IntEntry(p_00,iVar6);
                      if (iVar3 == 0x20) {
                        iVar3 = Wln_ObjFanin0(p,iVar6);
                        pcVar15 = Wln_ObjName(p,iVar3);
                        pcVar8 = "|%s";
                      }
                      else {
                        iVar3 = Vec_IntEntry(p_00,iVar6);
                        if (iVar3 == 0x22) {
                          iVar3 = Wln_ObjFanin0(p,iVar6);
                          pcVar15 = Wln_ObjName(p,iVar3);
                          pcVar8 = "^%s";
                        }
                        else {
                          iVar3 = Vec_IntEntry(p_00,iVar6);
                          if (iVar3 == 0x1f) {
                            iVar3 = Wln_ObjFanin0(p,iVar6);
                            pcVar15 = Wln_ObjName(p,iVar3);
                            pcVar8 = "~&%s";
                          }
                          else {
                            iVar3 = Vec_IntEntry(p_00,iVar6);
                            if (iVar3 == 0x21) {
                              iVar3 = Wln_ObjFanin0(p,iVar6);
                              pcVar15 = Wln_ObjName(p,iVar3);
                              pcVar8 = "~|%s";
                            }
                            else {
                              iVar3 = Vec_IntEntry(p_00,iVar6);
                              if (iVar3 != 0x23) {
                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                if (iVar3 == 0x5b) {
                                  iVar3 = Wln_ObjFanin0(p,iVar6);
                                  pcVar15 = Wln_ObjName(p,iVar3);
                                  uVar7 = Wln_ObjRangeEnd(p,iVar6);
                                  uVar1 = Wln_ObjRangeBeg(p,iVar6);
                                  fprintf((FILE *)pFile,"%s [%d:%d]",pcVar15,(ulong)uVar7,
                                          (ulong)uVar1);
                                }
                                else {
                                  iVar3 = Vec_IntEntry(p_00,iVar6);
                                  if (iVar3 == 0x5e) {
                                    iVar3 = Wln_ObjRange(p,iVar6);
                                    iVar4 = Wln_ObjFanin0(p,iVar6);
                                    iVar4 = Wln_ObjRange(p,iVar4);
                                    iVar5 = Wln_ObjFanin0(p,iVar6);
                                    pcVar15 = Wln_ObjName(p,iVar5);
                                    iVar5 = Wln_ObjFanin0(p,iVar6);
                                    iVar5 = Wln_ObjRange(p,iVar5);
                                    iObj = Wln_ObjFanin0(p,iVar6);
                                    pcVar8 = Wln_ObjName(p,iObj);
                                    fprintf((FILE *)pFile,"{ {%d{%s[%d]}}, %s }",
                                            (ulong)(uint)(iVar3 - iVar4),pcVar15,(ulong)(iVar5 - 1),
                                            pcVar8);
                                  }
                                  else {
                                    iVar3 = Vec_IntEntry(p_00,iVar6);
                                    if (iVar3 == 0x5d) {
                                      iVar3 = Wln_ObjRange(p,iVar6);
                                      iVar4 = Wln_ObjFanin0(p,iVar6);
                                      iVar4 = Wln_ObjRange(p,iVar4);
                                      iVar5 = Wln_ObjFanin0(p,iVar6);
                                      pcVar15 = Wln_ObjName(p,iVar5);
                                      fprintf((FILE *)pFile,"{ {%d{1\'b0}}, %s }",
                                              (ulong)(uint)(iVar3 - iVar4),pcVar15);
                                    }
                                    else {
                                      iVar3 = Vec_IntEntry(p_00,iVar6);
                                      if (iVar3 == 0x5c) {
                                        fputc(0x7b,(FILE *)pFile);
                                        for (iVar3 = 0; iVar3 < p->vFanins[uVar19].nSize;
                                            iVar3 = iVar3 + 1) {
                                          iVar4 = Wln_ObjFanin(p,iVar6,iVar3);
                                          if (iVar4 != 0) {
                                            pcVar15 = Wln_ObjName(p,iVar4);
                                            pcVar8 = ",";
                                            if (iVar3 == p->vFanins[uVar19].nSize + -1) {
                                              pcVar8 = "";
                                            }
                                            fprintf((FILE *)pFile," %s%s",pcVar15,pcVar8);
                                          }
                                        }
                                        fwrite(" }",2,1,(FILE *)pFile);
                                      }
                                      else {
                                        paVar14 = &p->vFanins[uVar19].field_2;
                                        if (2 < p->vFanins[uVar19].nSize) {
                                          paVar14 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)
                                                    paVar14->pArray[0];
                                        }
                                        pcVar15 = Wln_ObjName(p,paVar14->Array[0]);
                                        fprintf((FILE *)pFile,"%s ",pcVar15);
                                        iVar3 = Vec_IntEntry(p_00,iVar6);
                                        if (iVar3 == 0x45) {
                                          pcVar15 = ">>";
                                          goto LAB_003241d0;
                                        }
                                        iVar3 = Vec_IntEntry(p_00,iVar6);
                                        if (iVar3 == 0x47) {
                                          pcVar15 = ">>>";
LAB_003241f3:
                                          __size = 3;
LAB_003241f5:
                                          fwrite(pcVar15,__size,1,(FILE *)pFile);
                                        }
                                        else {
                                          iVar3 = Vec_IntEntry(p_00,iVar6);
                                          if (iVar3 == 0x44) {
                                            pcVar15 = "<<";
                                            goto LAB_003241d0;
                                          }
                                          iVar3 = Vec_IntEntry(p_00,iVar6);
                                          if (iVar3 == 0x46) {
                                            pcVar15 = "<<<";
                                            goto LAB_003241f3;
                                          }
                                          iVar3 = Vec_IntEntry(p_00,iVar6);
                                          if (iVar3 == 0xd) {
                                            iVar3 = 0x26;
                                          }
                                          else {
                                            iVar3 = Vec_IntEntry(p_00,iVar6);
                                            if (iVar3 == 0xf) {
                                              iVar3 = 0x7c;
                                            }
                                            else {
                                              iVar3 = Vec_IntEntry(p_00,iVar6);
                                              if (iVar3 != 0x11) {
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0xe) {
                                                  pcVar15 = "~&";
LAB_003241d0:
                                                  __size = 2;
                                                  goto LAB_003241f5;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x10) {
                                                  pcVar15 = "~|";
                                                  goto LAB_003241d0;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x12) {
                                                  pcVar15 = "~^";
                                                  goto LAB_003241d0;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x5f) {
                                                  pcVar15 = "=>";
                                                  goto LAB_003241d0;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x25) {
                                                  pcVar15 = "&&";
                                                  goto LAB_003241d0;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x27) {
                                                  pcVar15 = "||";
                                                  goto LAB_003241d0;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x29) {
                                                  pcVar15 = "^^";
                                                  goto LAB_003241d0;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x42) {
                                                  pcVar15 = "==";
                                                  goto LAB_003241d0;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x43) {
                                                  pcVar15 = "!=";
                                                  goto LAB_003241d0;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x3e) {
                                                  iVar3 = 0x3c;
                                                  goto LAB_003242f2;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x41) {
                                                  iVar3 = 0x3e;
                                                  goto LAB_003242f2;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x3f) {
                                                  pcVar15 = "<=";
                                                  goto LAB_003241d0;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x40) {
                                                  pcVar15 = ">=";
                                                  goto LAB_003241d0;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x32) {
                                                  iVar3 = 0x2b;
                                                  goto LAB_003242f2;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x33) {
                                                  iVar3 = 0x2d;
                                                  goto LAB_003242f2;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x34) {
                                                  iVar3 = 0x2a;
                                                  goto LAB_003242f2;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if (iVar3 == 0x36) {
                                                  iVar3 = 0x2f;
                                                  goto LAB_003242f2;
                                                }
                                                iVar3 = Vec_IntEntry(p_00,iVar6);
                                                if ((iVar3 != 0x38) &&
                                                   (iVar3 = Vec_IntEntry(p_00,iVar6), iVar3 != 0x37)
                                                   ) {
                                                  iVar3 = Vec_IntEntry(p_00,iVar6);
                                                  if (iVar3 == 0x39) {
                                                    pcVar15 = "**";
                                                    goto LAB_003241d0;
                                                  }
                                                  iVar3 = Vec_IntEntry(p_00,iVar6);
                                                  if (iVar3 == 0x3b) {
                                                    iVar3 = 0x40;
                                                  }
                                                  else {
                                                    iVar3 = Vec_IntEntry(p_00,iVar6);
                                                    if (iVar3 != 0x60) {
                                                      pcVar15 = Wln_ObjName(p,iVar6);
                                                      uVar7 = Vec_IntEntry(p_00,iVar6);
                                                      printf(
                                                  "Failed to write node \"%s\" with unknown operator type (%d).\n"
                                                  ,pcVar15,(ulong)uVar7);
                                                  pcVar15 = "???\n";
                                                  goto LAB_00323831;
                                                  }
                                                  iVar3 = 0x23;
                                                  }
                                                  goto LAB_003242f2;
                                                }
                                                fprintf((FILE *)pFile,"%%");
                                                goto LAB_00324203;
                                              }
                                              iVar3 = 0x5e;
                                            }
                                          }
LAB_003242f2:
                                          fputc(iVar3,(FILE *)pFile);
                                        }
LAB_00324203:
                                        paVar14 = &p->vFanins[uVar19].field_2;
                                        if (2 < p->vFanins[uVar19].nSize) {
                                          paVar14 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)
                                                    paVar14->pArray[0];
                                        }
                                        pcVar15 = Wln_ObjName(p,paVar14->Array[1]);
                                        fprintf((FILE *)pFile," %s",pcVar15);
                                        if ((p->vFanins[uVar19].nSize == 3) &&
                                           (iVar3 = Vec_IntEntry(p_00,iVar6), iVar3 == 0x32)) {
                                          paVar14 = &p->vFanins[uVar19].field_2;
                                          if (2 < p->vFanins[uVar19].nSize) {
                                            paVar14 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)
                                                      paVar14->pArray[0];
                                          }
                                          pcVar15 = Wln_ObjName(p,paVar14[1].Array[0]);
                                          pcVar8 = " + %s";
                                          goto LAB_00322f59;
                                        }
                                      }
                                    }
                                  }
                                }
                                goto LAB_00323066;
                              }
                              iVar3 = Wln_ObjFanin0(p,iVar6);
                              pcVar15 = Wln_ObjName(p,iVar3);
                              pcVar8 = "~^%s";
                            }
                          }
                        }
                      }
LAB_00322f59:
                      fprintf((FILE *)pFile,pcVar8,pcVar15);
                      goto LAB_00323066;
                    }
                    iVar3 = Wln_ObjFanin0(p,iVar6);
                    pcVar15 = Wln_ObjName(p,iVar3);
                    pcVar8 = "&%s";
                  }
                }
              }
LAB_00322e4e:
              fprintf((FILE *)pFile,pcVar8,pcVar15);
              goto LAB_00323066;
            }
            iVar3 = Wln_ObjFanin0(p,iVar6);
            pcVar15 = Wln_ObjName(p,iVar3);
            fprintf((FILE *)pFile,"%s ? ",pcVar15);
            iVar3 = Wln_ObjFanin1(p,iVar6);
            pcVar15 = Wln_ObjName(p,iVar3);
            fprintf((FILE *)pFile,"%s : ",pcVar15);
            iVar3 = Wln_ObjFanin2(p,iVar6);
          }
          pcVar15 = Wln_ObjName(p,iVar3);
          fputs(pcVar15,(FILE *)pFile);
          goto LAB_00323066;
        }
        pcVar8 = "%s ;\n";
        goto LAB_00323096;
      }
      pcVar15 = Wln_ObjName(p,iVar6);
      fprintf((FILE *)pFile,"%s ;\n",pcVar15);
      fwrite("         ",9,1,(FILE *)pFile);
      fwrite("always @( ",10,1,(FILE *)pFile);
      for (iVar3 = 0; iVar3 < p->vFanins[uVar19].nSize; iVar3 = iVar3 + 1) {
        iVar4 = Wln_ObjFanin(p,iVar6,iVar3);
        if (iVar4 != 0) {
          pcVar15 = " or ";
          if (iVar3 == 0) {
            pcVar15 = "";
          }
          pcVar8 = Wln_ObjName(p,iVar4);
          fprintf((FILE *)pFile,"%s%s",pcVar15,pcVar8);
        }
      }
      fwrite(" )\n",3,1,(FILE *)pFile);
      fwrite("           ",0xb,1,(FILE *)pFile);
      fwrite("begin\n",6,1,(FILE *)pFile);
      fwrite("             ",0xd,1,(FILE *)pFile);
      paVar14 = &p->vFanins[uVar19].field_2;
      if (2 < p->vFanins[uVar19].nSize) {
        paVar14 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar14->pArray[0];
      }
      pcVar15 = Wln_ObjName(p,paVar14->Array[0]);
      fprintf((FILE *)pFile,"case ( %s )\n",pcVar15);
      for (iVar3 = 0; iVar3 < p->vFanins[uVar19].nSize; iVar3 = iVar3 + 1) {
        iVar4 = Wln_ObjFanin(p,iVar6,iVar3);
        if ((iVar3 != 0) && (iVar4 != 0)) {
          fwrite("               ",0xf,1,(FILE *)pFile);
          pcVar15 = Wln_ObjName(p,iVar6);
          fprintf((FILE *)pFile,"%d : %s = ",(ulong)(iVar3 - 1),pcVar15);
          iVar4 = Wln_ObjFanin(p,iVar6,iVar3);
          pcVar15 = Wln_ObjName(p,iVar4);
          fprintf((FILE *)pFile,"%s ;\n",pcVar15);
        }
      }
      fwrite("             ",0xd,1,(FILE *)pFile);
      fwrite("endcase\n",8,1,(FILE *)pFile);
      fwrite("           ",0xb,1,(FILE *)pFile);
      fwrite("end\n",4,1,(FILE *)pFile);
    }
LAB_0032309d:
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void Wln_WriteVerInt( FILE * pFile, Wln_Ntk_t * p )
{
    int k, j, iObj, iFanin;
    char Range[100];
    fprintf( pFile, "module %s ( ", p->pName );
    fprintf( pFile, "\n   " );
    if ( Wln_NtkCiNum(p) > 0 )
    {
        Wln_WriteVerIntVec( pFile, p, &p->vCis, 3 );
        fprintf( pFile, ",\n   " );
    }
    if ( Wln_NtkCoNum(p) > 0 )
        Wln_WriteVerIntVec( pFile, p, &p->vCos, 3 );
    fprintf( pFile, "  );\n" );
    Wln_NtkForEachObj( p, iObj )
    {
        int End = Wln_ObjRangeEnd(p, iObj);
        int Beg = Wln_ObjRangeBeg(p, iObj);
        int nDigits = Abc_Base10Log(Abc_AbsInt(End)+1) + Abc_Base10Log(Abc_AbsInt(Beg)+1) + (int)(End < 0) + (int)(Beg < 0);
        sprintf( Range, "%s[%d:%d]%*s", (!p->fSmtLib && Wln_ObjIsSigned(p, iObj)) ? "signed ":"       ", End, Beg, 8-nDigits, "" );
        fprintf( pFile, "  " );
        if ( Wln_ObjIsCi(p, iObj) )
            fprintf( pFile, "input  " );
        else if ( Wln_ObjIsCo(p, iObj) )
            fprintf( pFile, "output " );
        else
            fprintf( pFile, "       " );
        if ( Wln_ObjIsCio(p, iObj) )
        {
            fprintf( pFile, "wire %s %s ;\n", Range, Wln_ObjName(p, iObj) );
            if ( Wln_ObjIsCi(p, iObj) )
                continue;
            fprintf( pFile, "  assign                         " );
            fprintf( pFile, "%-16s = %s ;\n", Wln_ObjName(p, iObj), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            continue;
        }
        if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_NMUX || Wln_ObjType(p, iObj) == ABC_OPER_SEL_SEL )
            fprintf( pFile, "reg  %s ", Range );
        else
            fprintf( pFile, "wire %s ", Range );
        if ( Wln_ObjType(p, iObj) == ABC_OPER_TABLE )
        {
            // wire [3:0] s4972; table0 s4972_Index(s4971, s4972);
            fprintf( pFile, "%s ;              table%d", Wln_ObjName(p, iObj), Wln_ObjFanin1(p, iObj) );
            fprintf( pFile, " s%d_Index(%s, ", iObj, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            fprintf( pFile, "%s)",             Wln_ObjName(p, iObj) );
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_LUT )
        {
            // wire [3:0] s4972; LUT lut4972_Index(s4971, s4972);
            fprintf( pFile, "%s ;           LUT", Wln_ObjName(p, iObj) );
            fprintf( pFile, " lut%d (%s, ", iObj, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            for ( k = 1; k < Wln_ObjFaninNum(p, iObj); k++ )
                fprintf( pFile, "%s, ", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, "%s)",             Wln_ObjName(p, iObj) );
        }
        else if ( Wln_ObjIsConst(p, iObj) )
            fprintf( pFile, "%-16s = %s", Wln_ObjName(p, iObj), Wln_ObjConstString(p, iObj) );
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTR || Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTL )
        {
            //  wire [27:0] s4960 = (s57 >> 17) | (s57 << 11);
            int Num0 = Wln_ObjFanin1(p, iObj);
            int Num1 = Wln_ObjRange(p, iObj) - Num0;
            assert( Num0 > 0 && Num0 < Wln_ObjRange(p, iObj) );
            fprintf( pFile, "%-16s = ", Wln_ObjName(p, iObj) );
            if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTR )
                fprintf( pFile, "(%s >> %d) | (%s << %d)", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num0, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num1 );
            else
                fprintf( pFile, "(%s << %d) | (%s >> %d)", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num0, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num1 );
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_NMUX )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "always @( " );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
                fprintf( pFile, "%s%s", k ? " or ":"", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, " )\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "begin\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "case ( %s )\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
            {
                if ( !k ) continue;
                fprintf( pFile, "               " );
                fprintf( pFile, "%d : %s = ", k-1, Wln_ObjName(p, iObj) );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            }
            fprintf( pFile, "             " );
            fprintf( pFile, "endcase\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "end\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_SEL )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "always @( " );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
                fprintf( pFile, "%s%s", k ? " or ":"", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, " )\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "begin\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "case ( %s )\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
            {
                if ( !k ) continue;
                fprintf( pFile, "               " );
                fprintf( pFile, "%d\'b", Wln_ObjFaninNum(p, iObj)-1 );
                for ( j = Wln_ObjFaninNum(p, iObj)-1; j > 0; j-- )
                    fprintf( pFile, "%d", (int)(j==k) );
                fprintf( pFile, " : %s = ", Wln_ObjName(p, iObj) );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            }
            fprintf( pFile, "               " );
            fprintf( pFile, "default" );
            fprintf( pFile, " : %s = ", Wln_ObjName(p, iObj) );
            fprintf( pFile, "%d\'b", Wln_ObjRange(p, iObj) );
            for ( j = Wln_ObjRange(p, iObj)-1; j >= 0; j-- )
                fprintf( pFile, "%d", 0 );
            fprintf( pFile, " ;\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "endcase\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "end\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_DEC )
        {
            int nRange = Wln_ObjRange(p, Wln_ObjFanin0(p, iObj));
            assert( (1 << nRange) == Wln_ObjRange(p, iObj) );
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            for ( k = 0; k < Wln_ObjRange(p, iObj); k++ )
            {
                fprintf( pFile, "         " );
                fprintf( pFile, "wire " );
                fprintf( pFile, "%s_", Wln_ObjName(p, iObj) );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%d", (k >> (nRange-1-j)) & 1 );
                fprintf( pFile, " = " );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%s%s%s[%d]", 
                        j ? " & ":"", ((k >> (nRange-1-j)) & 1) ? " ":"~", 
                        Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)), nRange-1-j );
                fprintf( pFile, " ;\n" );
            }
            fprintf( pFile, "         " );
            fprintf( pFile, "assign %s = { ", Wln_ObjName(p, iObj) );
            for ( k = Wln_ObjRange(p, iObj)-1; k >= 0; k-- )
            {
                fprintf( pFile, "%s%s_", k < Wln_ObjRange(p, iObj)-1 ? ", ":"", Wln_ObjName(p, iObj) );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%d", (k >> (nRange-1-j)) & 1 );
            }
            fprintf( pFile, " } ;\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADDSUB )
        {
            // out = mode ? a+b+cin : a-b-cin
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "assign " );
            fprintf( pFile, "%s = %s ? %s + %s + %s : %s - %s - %s ;\n", 
                        Wln_ObjName(p, iObj), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)),
                        Wln_ObjName(p, Wln_ObjFanin2(p, iObj)), Wln_ObjName(p, Wln_ObjFanin(p, iObj,3)), Wln_ObjName(p, Wln_ObjFanin1(p, iObj)),
                        Wln_ObjName(p, Wln_ObjFanin2(p, iObj)), Wln_ObjName(p, Wln_ObjFanin(p, iObj,3)), Wln_ObjName(p, Wln_ObjFanin1(p, iObj)) 
                   );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_RAMR || Wln_ObjType(p, iObj) == ABC_OPER_RAMW )
        {
            if ( 1 )
            {
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
                fprintf( pFile, "         " );
                fprintf( pFile, "%s (", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "ABC_READ" : "ABC_WRITE" );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " .%s(%s),", k==0 ? "mem_in" : (k==1 ? "addr": "data"), Wln_ObjName(p, iFanin) );
                fprintf( pFile, " .%s(%s) ) ;\n", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "data" : "mem_out", Wln_ObjName(p, iObj) );
                continue;
            }
            else
            {
                int nBitsMem  = Wln_ObjRange(p,  Wln_ObjFanin(p, iObj, 0) );
                //int nBitsAddr = Wln_ObjRange(p,  Wln_ObjFanin(p, iObj, 1) );
                int nBitsDat  = Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? Wln_ObjRange(p, iObj) : Wln_ObjRange(p, Wln_ObjFanin(p, iObj, 2));
                int Depth     = nBitsMem / nBitsDat;
                assert( nBitsMem % nBitsDat == 0 );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
                fprintf( pFile, "         " );
                fprintf( pFile, "%s_%d (", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "CPL_MEM_READ" : "CPL_MEM_WRITE", Depth );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " .%s(%s),", k==0 ? "mem_data_in" : (k==1 ? "addr_in": "data_in"), Wln_ObjName(p, iFanin) );
                fprintf( pFile, " .%s(%s) ) ;\n", "data_out", Wln_ObjName(p, iObj) );
                continue;
            }
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_DFFRSE )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            continue;
        }
        else 
        {
            fprintf( pFile, "%-16s = ", Wln_ObjName(p, iObj) );
            if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_BUF )
                fprintf( pFile, "%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_MUX )
            {
                fprintf( pFile, "%s ? ", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
                fprintf( pFile, "%s : ", Wln_ObjName(p, Wln_ObjFanin1(p, iObj)) );
                fprintf( pFile, "%s",    Wln_ObjName(p, Wln_ObjFanin2(p, iObj)) );
            }
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MIN )
                fprintf( pFile, "-%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_INV )
                fprintf( pFile, "~%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_NOT )
                fprintf( pFile, "!%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_AND )
                fprintf( pFile, "&%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_OR )
                fprintf( pFile, "|%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_XOR )
                fprintf( pFile, "^%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NAND )
                fprintf( pFile, "~&%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NOR )
                fprintf( pFile, "~|%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NXOR )
                fprintf( pFile, "~^%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_SLICE )
                fprintf( pFile, "%s [%d:%d]", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_SIGNEXT )
                fprintf( pFile, "{ {%d{%s[%d]}}, %s }", Wln_ObjRange(p, iObj) - Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)) - 1, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_ZEROPAD )
                fprintf( pFile, "{ {%d{1\'b0}}, %s }", Wln_ObjRange(p, iObj) - Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_CONCAT )
            {
                fprintf( pFile, "{" );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " %s%s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)), k == Wln_ObjFaninNum(p, iObj)-1 ? "":"," );
                fprintf( pFile, " }" );
            }
            else
            {
                fprintf( pFile, "%s ", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
                if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_R )
                    fprintf( pFile, ">>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_RA )
                    fprintf( pFile, ">>>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_L )
                    fprintf( pFile, "<<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_LA )
                    fprintf( pFile, "<<<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_AND )
                    fprintf( pFile, "&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_OR )
                    fprintf( pFile, "|" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_XOR )
                    fprintf( pFile, "^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NAND )
                    fprintf( pFile, "~&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NOR )
                    fprintf( pFile, "~|" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NXOR )
                    fprintf( pFile, "~^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_IMPL )
                    fprintf( pFile, "=>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_AND )
                    fprintf( pFile, "&&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_OR )
                    fprintf( pFile, "||" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_XOR )
                    fprintf( pFile, "^^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_EQU )
                    fprintf( pFile, "==" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_NOTEQU )
                    fprintf( pFile, "!=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_LESS )
                    fprintf( pFile, "<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_MORE )
                    fprintf( pFile, ">" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_LESSEQU )
                    fprintf( pFile, "<=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_MOREEQU )
                    fprintf( pFile, ">=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADD )
                    fprintf( pFile, "+" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SUB )
                    fprintf( pFile, "-" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MUL )
                    fprintf( pFile, "*" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_DIV )
                    fprintf( pFile, "/" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_REM )
                    fprintf( pFile, "%%" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MOD )
                    fprintf( pFile, "%%" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_POW )
                    fprintf( pFile, "**" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SQRT )
                    fprintf( pFile, "@" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SQUARE )
                    fprintf( pFile, "#" );
                else 
                {
                    //assert( 0 );
                    printf( "Failed to write node \"%s\" with unknown operator type (%d).\n", Wln_ObjName(p, iObj), Wln_ObjType(p, iObj) );
                    fprintf( pFile, "???\n" );
                    continue;
                }
                fprintf( pFile, " %s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 1)) );
                if ( Wln_ObjFaninNum(p, iObj) == 3 && Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADD ) 
                    fprintf( pFile, " + %s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 2)) );
            }
        }
        fprintf( pFile, " ;%s\n", (p->fSmtLib && Wln_ObjIsSigned(p, iObj)) ? " // signed SMT-LIB operator" : "" );
    }
    iFanin = 0;
    // write DFFs in the end
    fprintf( pFile, "\n" );
    Wln_NtkForEachFf( p, iObj, j )
    {
        char * pInNames[8] = {"d", "clk", "reset", "set", "enable", "async", "sre", "init"};
        fprintf( pFile, "         " );
        fprintf( pFile, "%s (", "ABC_DFFRSE" );
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            if ( iFanin ) fprintf( pFile, " .%s(%s),", pInNames[k], Wln_ObjName(p, iFanin) );
        fprintf( pFile, " .%s(%s) ) ;\n", "q", Wln_ObjName(p, iObj) );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "endmodule\n\n" );
}